

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraWiSample> * __thiscall
pbrt::PerspectiveCamera::SampleWi
          (PerspectiveCamera *this,Interaction *ref,Point2f *u,SampledWavelengths *lambda)

{
  Point2f pRaster_00;
  bool bVar1;
  long in_RSI;
  CameraBase *in_RDI;
  type tVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar12 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  Point3f PVar15;
  Vector3f VVar16;
  Vector3<float> VVar17;
  SampledSpectrum SVar18;
  SampledSpectrum Wi;
  Point2f pRaster;
  Float pdf;
  Float lensArea;
  Float dist;
  Vector3f wi;
  Interaction lensIntr;
  Normal3f n;
  Point3f pLensRender;
  Point2f pLens;
  float in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcbc;
  float fVar19;
  Interaction *in_stack_fffffffffffffcc0;
  optional<pbrt::CameraWiSample> *this_00;
  Point3<float> *in_stack_fffffffffffffcc8;
  Interaction *pRef;
  Normal3f *in_stack_fffffffffffffcd0;
  Float pdf_00;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  float fVar20;
  CameraBase *this_01;
  float in_stack_fffffffffffffcf0;
  float fVar21;
  Point2f *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 uVar22;
  Interaction *this_02;
  Point2f *in_stack_fffffffffffffd98;
  SampledWavelengths *in_stack_fffffffffffffda0;
  Ray *in_stack_fffffffffffffda8;
  PerspectiveCamera *in_stack_fffffffffffffdb0;
  Interaction local_1d8;
  undefined8 local_174;
  undefined8 local_16c;
  undefined1 local_164 [8];
  float local_15c;
  float local_158;
  float local_154;
  anon_struct_8_0_00000001_for___align local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined1 local_104 [204];
  undefined8 local_38;
  undefined8 local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [56];
  
  fVar21 = *(float *)(in_RSI + 0x580);
  this_01 = in_RDI;
  auVar3._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffcf8);
  auVar3._8_56_ = extraout_var;
  local_38 = vmovlpd_avx(auVar3._0_16_);
  auVar4._0_8_ = pbrt::operator*(in_stack_fffffffffffffcbc,(Tuple2<pbrt::Point2,_float> *)0x741e44);
  auVar4._8_56_ = extraout_var_00;
  local_30 = vmovlpd_avx(auVar4._0_16_);
  uVar22 = 0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
             in_stack_fffffffffffffcb8,0.0);
  auVar12 = (undefined1  [56])0x0;
  PVar15 = CameraBase::RenderFromCamera
                     (in_RDI,(Point3f *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                      (Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  local_104._164_4_ = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar12;
  local_104._156_8_ = vmovlpd_avx(auVar5._0_16_);
  this_02 = (Interaction *)(local_104 + 0x78);
  local_104._188_8_ = local_104._156_8_;
  local_104._196_4_ = local_104._164_4_;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
             in_stack_fffffffffffffcb8,0.0);
  auVar12 = (undefined1  [56])0x0;
  VVar16 = CameraBase::RenderFromCamera
                     (in_RDI,(Vector3f *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                      (Float)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  local_104._108_4_ = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar12;
  local_104._100_8_ = vmovlpd_avx(auVar6._0_16_);
  local_104._132_8_ = local_104._100_8_;
  local_104._140_4_ = local_104._108_4_;
  Normal3<float>::Normal3<float>
            ((Normal3<float> *)in_stack_fffffffffffffcc0,
             (Vector3<float> *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  MediumHandle::MediumHandle
            ((MediumHandle *)in_stack_fffffffffffffcc0,
             (MediumHandle *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  auVar12 = (undefined1  [56])0x0;
  Interaction::Interaction
            ((Interaction *)in_RDI,
             (Point3f *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0,(Float)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
             (MediumHandle *)in_stack_fffffffffffffcc0);
  PVar15 = Interaction::p(in_stack_fffffffffffffcc0);
  local_118 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar12;
  local_120 = vmovlpd_avx(auVar7._0_16_);
  local_110 = local_120;
  local_108 = local_118;
  PVar15 = Interaction::p(in_stack_fffffffffffffcc0);
  local_138 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar12;
  local_140 = vmovlpd_avx(auVar8._0_16_);
  local_130 = local_140;
  local_128 = local_138;
  VVar17 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_148 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  local_150 = (anon_struct_8_0_00000001_for___align)vmovlpd_avx(auVar9._0_16_);
  local_104._0_8_ = local_150;
  local_104._8_4_ = local_148;
  local_154 = Length<float>((Vector3<float> *)0x742079);
  Tuple3<pbrt::Vector3,float>::operator/=((Tuple3<pbrt::Vector3,float> *)local_104,local_154);
  if ((*(float *)(in_RSI + 0x580) != 0.0) || (NAN(*(float *)(in_RSI + 0x580)))) {
    fVar20 = *(float *)(in_RSI + 0x580) * 3.1415927 * *(float *)(in_RSI + 0x580);
  }
  else {
    fVar20 = 1.0;
  }
  fVar19 = local_154 * local_154;
  this_00 = (optional<pbrt::CameraWiSample> *)local_104;
  local_158 = fVar20;
  tVar2 = AbsDot<float>((Normal3<float> *)this_00,
                        (Vector3<float> *)CONCAT44(fVar19,in_stack_fffffffffffffcb8));
  auVar14 = SUB6056((undefined1  [60])0x0,4);
  local_15c = fVar19 / (tVar2 * local_158);
  auVar12 = ZEXT856(0);
  pdf_00 = (Float)((ulong)local_164 >> 0x20);
  Point2<float>::Point2((Point2<float> *)this_00);
  VVar17 = Tuple3<pbrt::Vector3,_float>::operator-((Tuple3<pbrt::Vector3,_float> *)this_00);
  auVar10._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  vmovlpd_avx(auVar10._0_16_);
  pRef = &local_1d8;
  Interaction::SpawnRay(this_02,(Vector3f *)CONCAT44(uVar22,in_stack_fffffffffffffd00));
  SVar18 = We(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
              in_stack_fffffffffffffd98);
  auVar13._0_8_ = SVar18.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar11._0_8_ = SVar18.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  local_174 = vmovlpd_avx(auVar11._0_16_);
  local_16c = vmovlpd_avx(auVar13._0_16_);
  bVar1 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)pRef);
  if (bVar1) {
    pRaster_00.super_Tuple2<pbrt::Point2,_float>.y = fVar21;
    pRaster_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffcf0;
    CameraWiSample::CameraWiSample
              ((CameraWiSample *)this_01,(SampledSpectrum *)in_RDI,
               (Vector3f *)CONCAT44(fVar20,in_stack_fffffffffffffcd8),pdf_00,pRaster_00,pRef,
               (Interaction *)this_00);
    pstd::optional<pbrt::CameraWiSample>::optional
              (this_00,(CameraWiSample *)CONCAT44(fVar19,in_stack_fffffffffffffcb8));
  }
  else {
    memset(in_RDI,0,0xd0);
    pstd::optional<pbrt::CameraWiSample>::optional((optional<pbrt::CameraWiSample> *)in_RDI);
  }
  return (optional<pbrt::CameraWiSample> *)this_01;
}

Assistant:

pstd::optional<CameraWiSample> PerspectiveCamera::SampleWi(
    const Interaction &ref, const Point2f &u, SampledWavelengths &lambda) const {
    // Uniformly sample a lens interaction _lensIntr_
    Point2f pLens = lensRadius * SampleUniformDiskConcentric(u);
    Point3f pLensRender = RenderFromCamera(Point3f(pLens.x, pLens.y, 0), ref.time);
    Normal3f n = Normal3f(RenderFromCamera(Vector3f(0, 0, 1), ref.time));
    Interaction lensIntr(pLensRender, n, ref.time, medium);

    // Populate arguments and compute the importance value
    // Compute incident direction to camera _wi_ at _ref_
    Vector3f wi = lensIntr.p() - ref.p();
    Float dist = Length(wi);
    wi /= dist;

    // Compute PDF for importance arriving at _ref_
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    Float pdf = (dist * dist) / (AbsDot(lensIntr.n, wi) * lensArea);

    Point2f pRaster;
    SampledSpectrum Wi = We(lensIntr.SpawnRay(-wi), lambda, &pRaster);
    if (!Wi)
        return {};
    return CameraWiSample(Wi, wi, pdf, pRaster, ref, lensIntr);
}